

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

qsizetype __thiscall
QtPrivate::lastIndexOf
          (QtPrivate *this,QStringView viewHaystack,QString *stringHaystack,QRegularExpression *re,
          qsizetype from,QRegularExpressionMatch *rmatch)

{
  long lVar1;
  QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> QVar2;
  bool bVar3;
  qsizetype qVar4;
  long lVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  QStringView subjectView;
  QRegularExpressionMatch match;
  QRegularExpressionMatchIterator iterator;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QRegularExpression::isValid((QRegularExpression *)stringHaystack);
  if (bVar3) {
    iterator.d.d.ptr =
         (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)&DAT_aaaaaaaaaaaaaaaa
    ;
    if (viewHaystack.m_data == (storage_type_conflict *)0x0) {
      subjectView.m_data = (storage_type_conflict *)this;
      subjectView.m_size = (qsizetype)stringHaystack;
      QRegularExpression::globalMatchView
                ((QRegularExpression *)&iterator,subjectView,viewHaystack.m_size,NormalMatch,
                 (MatchOptions)0x0);
    }
    else {
      QRegularExpression::globalMatch
                ((QRegularExpression *)&iterator,stringHaystack,(qsizetype)viewHaystack.m_data,
                 NormalMatch,(MatchOptions)0x0);
    }
    lVar5 = (long)&(re->d).d.ptr + ((long)re >> 0x3f & (ulong)this);
    qVar6 = -1;
    do {
      bVar3 = QRegularExpressionMatchIterator::hasNext(&iterator);
      if (!bVar3) break;
      match.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&match);
      qVar4 = QRegularExpressionMatch::capturedStart(&match,0);
      if (qVar4 <= lVar5) {
        qVar6 = qVar4;
      }
      if (qVar4 <= lVar5 && from != 0) {
        QVar2.d.ptr = *(totally_ordered_wrapper<QRegularExpressionMatchPrivate_*> *)from;
        *(QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> *)from = match.d.d.ptr;
        qVar6 = qVar4;
        match.d.d.ptr =
             (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
             (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)QVar2.d.ptr;
      }
      QRegularExpressionMatch::~QRegularExpressionMatch(&match);
    } while (qVar4 <= lVar5);
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(&iterator);
  }
  else {
    QRegularExpression::pattern((QString *)&iterator,(QRegularExpression *)stringHaystack);
    qtWarnAboutInvalidRegularExpression((QString *)&iterator,"QString(View)::lastIndexOf");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&iterator);
    qVar6 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return qVar6;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QStringView viewHaystack, const QString *stringHaystack, const QRegularExpression &re, qsizetype from, QRegularExpressionMatch *rmatch)
{
    if (!re.isValid()) {
        qtWarnAboutInvalidRegularExpression(re.pattern(), "QString(View)::lastIndexOf");
        return -1;
    }

    qsizetype endpos = (from < 0) ? (viewHaystack.size() + from + 1) : (from + 1);
    QRegularExpressionMatchIterator iterator = stringHaystack
            ? re.globalMatch(*stringHaystack)
            : re.globalMatchView(viewHaystack);
    qsizetype lastIndex = -1;
    while (iterator.hasNext()) {
        QRegularExpressionMatch match = iterator.next();
        qsizetype start = match.capturedStart();
        if (start < endpos) {
            lastIndex = start;
            if (rmatch)
                *rmatch = std::move(match);
        } else {
            break;
        }
    }

    return lastIndex;
}